

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc)

{
  char *path;
  string local_80 [39];
  allocator local_59;
  undefined1 local_58 [8];
  string loc;
  char *pkgloc_local;
  cmOSXBundleGenerator *this_local;
  string *macdir;
  
  cmTarget::GetMacContentDirectory(__return_storage_ptr__,this->GT->Target,&this->ConfigName,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pkgloc);
  path = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(path);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,pkgloc,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::find((char)local_58,0x2f);
  std::__cxx11::string::substr((ulong)local_80,(ulong)local_58);
  std::__cxx11::string::operator=((string *)local_58,local_80);
  std::__cxx11::string::~string(local_80);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this->MacContentFolders,(value_type *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOSXBundleGenerator::InitMacOSXContentDirectory(const char* pkgloc)
{
  // Construct the full path to the content subdirectory.

  std::string macdir =
    this->GT->Target->GetMacContentDirectory(this->ConfigName,
                                         /*implib*/ false);
  macdir += "/";
  macdir += pkgloc;
  cmSystemTools::MakeDirectory(macdir.c_str());

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
  std::string loc = pkgloc;
  loc = loc.substr(0, loc.find('/'));
  this->MacContentFolders->insert(loc);
  }

  return macdir;
}